

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

void __thiscall tcmalloc::PageHeap::PageHeap(PageHeap *this,Length smallest_span_size)

{
  _Rb_tree_header *p_Var1;
  LogItem b;
  LogItem c;
  LogItem d;
  long lVar2;
  Span *list;
  bool bVar3;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  undefined4 uStack_2c;
  anon_union_8_4_e5b1a622_for_u_ aStack_28;
  
  this->smallest_span_size_ = smallest_span_size;
  (this->lock_).lockword_.super___atomic_base<int>._M_i = 0;
  memset(&this->pagemap_cache_,0x80,0x80000);
  (this->pagemap_).allocator_ = MetaDataAlloc;
  memset(&this->pagemap_,0,0x100000);
  p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar2 = 0x180078;
  do {
    SpanList::SpanList((SpanList *)((long)(this->pagemap_cache_).array_ + lVar2 + -0x10));
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x183078);
  (this->stats_).total_reserve_bytes = 0;
  this->scavenge_counter_ = 0;
  (this->stats_).total_decommit_bytes = 0;
  (this->stats_).reserve_count = 0;
  (this->stats_).total_commit_bytes = 0;
  (this->stats_).decommit_count = 0;
  (this->stats_).scavenge_count = 0;
  (this->stats_).commit_count = 0;
  (this->stats_).unmapped_bytes = 0;
  (this->stats_).committed_bytes = 0;
  (this->stats_).system_bytes = 0;
  (this->stats_).free_bytes = 0;
  this->release_index_ = 0x80;
  this->aggressive_decommit_ = false;
  if ((this->smallest_span_size_ & this->smallest_span_size_ - 1) == 0) {
    list = &this->free_[0].returned;
    lVar2 = 0x80;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      DLL_Init(list + -1);
      DLL_Init(list);
      list = list + 2;
    }
    return;
  }
  d._4_4_ = uStack_2c;
  d.tag_ = 4;
  c._4_4_ = uStack_3c;
  c.tag_ = 4;
  b._4_4_ = uStack_4c;
  b.tag_ = 4;
  b.u_.str = aStack_48.str;
  c.u_.str = aStack_38.str;
  d.u_.str = aStack_28.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc",
      0x5c,(LogItem)(ZEXT816(0x12e796) << 0x40),b,c,d);
  do {
  } while( true );
}

Assistant:

PageHeap::PageHeap(Length smallest_span_size)
    : smallest_span_size_(smallest_span_size),
      pagemap_(MetaDataAlloc),
      scavenge_counter_(0),
      // Start scavenging at kMaxPages list
      release_index_(kMaxPages),
      aggressive_decommit_(false) {
  static_assert(kClassSizesMax <= (1 << PageMapCache::kValuebits));
  // smallest_span_size needs to be power of 2.
  CHECK_CONDITION((smallest_span_size_ & (smallest_span_size_-1)) == 0);
  for (int i = 0; i < kMaxPages; i++) {
    DLL_Init(&free_[i].normal);
    DLL_Init(&free_[i].returned);
  }
}